

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabInitVtab(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,char **pzErr
                     )

{
  long lVar1;
  char **__s;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  long in_RCX;
  int in_EDX;
  u64 in_RSI;
  undefined8 in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  int nTab;
  int nDb;
  char *zType;
  char *zTab;
  char *zDb;
  int nByte;
  int bDb;
  Fts5VocabTable *pRet;
  int eType;
  int rc;
  char *azSchema [3];
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int *peType;
  char **pzErr_00;
  char *zType_00;
  bool local_91;
  undefined4 uVar7;
  sqlite3 *db_00;
  int local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  db_00 = (sqlite3 *)0x0;
  local_91 = false;
  if (in_EDX == 6) {
    sVar4 = strlen(*(char **)(in_RCX + 8));
    local_91 = false;
    if (sVar4 == 4) {
      local_91 = **(int **)(in_RCX + 8) == 0x706d6574;
    }
  }
  uVar2 = (uint)local_91;
  if ((in_EDX == 5) || (uVar2 != 0)) {
    uVar7 = 0xaaaaaaaa;
    if (uVar2 == 0) {
      pcVar5 = *(char **)(in_RCX + 8);
      __s = *(char ***)(in_RCX + 0x18);
      peType = *(int **)(in_RCX + 0x20);
    }
    else {
      pcVar5 = *(char **)(in_RCX + 0x18);
      __s = *(char ***)(in_RCX + 0x20);
      peType = *(int **)(in_RCX + 0x28);
    }
    pzErr_00 = __s;
    zType_00 = pcVar5;
    sVar4 = strlen(pcVar5);
    sVar6 = strlen((char *)__s);
    iVar3 = (int)sVar6 + 1;
    local_2c = fts5VocabTableType(zType_00,pzErr_00,peType);
    if (local_2c == 0) {
      local_2c = sqlite3_declare_vtab(db_00,(char *)CONCAT44(uVar2,uVar7));
    }
    db_00 = (sqlite3 *)
            sqlite3Fts5MallocZero
                      (peType,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (db_00 != (sqlite3 *)0x0) {
      db_00->flags = in_RSI;
      *(undefined4 *)&db_00->lastRowid = 0;
      db_00->nDb = (int)in_RDI;
      db_00->mDbFlags = (int)((ulong)in_RDI >> 0x20);
      db_00->mutex = (sqlite3_mutex *)&db_00->szMmap;
      db_00->aDb = (Db *)((db_00->mutex->mutex).__size + iVar3);
      memcpy(db_00->mutex,__s,(long)iVar3);
      memcpy(db_00->aDb,pcVar5,(long)((int)sVar4 + 1));
      sqlite3Fts5Dequote((char *)peType);
      sqlite3Fts5Dequote((char *)peType);
    }
  }
  else {
    pcVar5 = sqlite3_mprintf("wrong number of vtable arguments");
    *in_R9 = pcVar5;
    local_2c = 1;
  }
  *in_R8 = db_00;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5VocabInitVtab(
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Pointer to Fts5Global object */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  const char *azSchema[] = {
    "CREATE TABlE vocab(" FTS5_VOCAB_COL_SCHEMA  ")",
    "CREATE TABlE vocab(" FTS5_VOCAB_ROW_SCHEMA  ")",
    "CREATE TABlE vocab(" FTS5_VOCAB_INST_SCHEMA ")"
  };

  Fts5VocabTable *pRet = 0;
  int rc = SQLITE_OK;             /* Return code */
  int bDb;

  bDb = (argc==6 && strlen(argv[1])==4 && memcmp("temp", argv[1], 4)==0);

  if( argc!=5 && bDb==0 ){
    *pzErr = sqlite3_mprintf("wrong number of vtable arguments");
    rc = SQLITE_ERROR;
  }else{
    int nByte;                      /* Bytes of space to allocate */
    const char *zDb = bDb ? argv[3] : argv[1];
    const char *zTab = bDb ? argv[4] : argv[3];
    const char *zType = bDb ? argv[5] : argv[4];
    int nDb = (int)strlen(zDb)+1;
    int nTab = (int)strlen(zTab)+1;
    int eType = 0;

    rc = fts5VocabTableType(zType, pzErr, &eType);
    if( rc==SQLITE_OK ){
      assert( eType>=0 && eType<ArraySize(azSchema) );
      rc = sqlite3_declare_vtab(db, azSchema[eType]);
    }

    nByte = sizeof(Fts5VocabTable) + nDb + nTab;
    pRet = sqlite3Fts5MallocZero(&rc, nByte);
    if( pRet ){
      pRet->pGlobal = (Fts5Global*)pAux;
      pRet->eType = eType;
      pRet->db = db;
      pRet->zFts5Tbl = (char*)&pRet[1];
      pRet->zFts5Db = &pRet->zFts5Tbl[nTab];
      memcpy(pRet->zFts5Tbl, zTab, nTab);
      memcpy(pRet->zFts5Db, zDb, nDb);
      sqlite3Fts5Dequote(pRet->zFts5Tbl);
      sqlite3Fts5Dequote(pRet->zFts5Db);
    }
  }

  *ppVTab = (sqlite3_vtab*)pRet;
  return rc;
}